

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_20c1::DataDump<short>::Run(DataDump<short> *this,istream *input_stream)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  int iVar6;
  short data;
  char buffer [128];
  char local_cb;
  short local_ca;
  string *local_c8;
  istream *local_c0;
  char local_b8 [136];
  int iVar7;
  
  iVar6 = this->minimum_index_;
  local_c0 = input_stream;
  bVar2 = sptk::ReadStream<short>(&local_ca,input_stream);
  if (bVar2) {
    local_c8 = &this->print_format_;
    bVar3 = sptk::SnPrintf<short>(local_ca,local_c8,0x80,local_b8);
    if (bVar3) {
      do {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
        local_cb = '\t';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_cb,1);
        sVar5 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_b8,sVar5);
        local_cb = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_cb,1);
        iVar7 = this->minimum_index_;
        iVar1 = this->maximum_index_;
        bVar2 = sptk::ReadStream<short>(&local_ca,local_c0);
        if (!bVar2) break;
        iVar7 = iVar7 + -1;
        if (iVar1 != iVar6) {
          iVar7 = iVar6;
        }
        if (iVar1 == -1) {
          iVar7 = iVar6;
        }
        iVar6 = iVar7 + 1;
        bVar3 = sptk::SnPrintf<short>(local_ca,local_c8,0x80,local_b8);
      } while (bVar3);
    }
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    T data;
    for (int index(minimum_index_); sptk::ReadStream(&data, input_stream);
         ++index) {
      // Format data.
      if (!sptk::SnPrintf(data, print_format_, sizeof(buffer), buffer)) {
        return false;
      }

      // Dump data. Note that std::endl makes the execution speed slow.
      std::cout << index << '\t' << buffer << '\n';

      // Initialize index.
      if (maximum_index_ != kMagicNumberForEndOfFile &&
          maximum_index_ == index) {
        index = minimum_index_ - 1;
      }
    }
    return true;
  }